

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O0

CPT * __thiscall despot::HierarchyCPT::CreateNoisyVariant(HierarchyCPT *this,double noise)

{
  NamedVar *child;
  int iVar1;
  HierarchyCPT *this_00;
  size_type sVar2;
  const_reference ppTVar3;
  undefined4 extraout_var;
  reference ppTVar4;
  int local_4c;
  int i;
  vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> local_38;
  HierarchyCPT *local_20;
  HierarchyCPT *hcpt;
  double noise_local;
  HierarchyCPT *this_local;
  
  hcpt = (HierarchyCPT *)noise;
  noise_local = (double)this;
  this_00 = (HierarchyCPT *)operator_new(0x70);
  child = (this->super_CPT).super_Function.child_;
  std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::vector
            (&local_38,&(this->super_CPT).super_Function.parents_);
  HierarchyCPT(this_00,child,&local_38);
  std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::~vector(&local_38);
  local_4c = 0;
  local_20 = this_00;
  while( true ) {
    sVar2 = std::vector<despot::TabularCPT_*,_std::allocator<despot::TabularCPT_*>_>::size
                      (&this->cpts_);
    if (sVar2 <= (ulong)(long)local_4c) break;
    ppTVar3 = std::vector<despot::TabularCPT_*,_std::allocator<despot::TabularCPT_*>_>::operator[]
                        (&this->cpts_,(long)local_4c);
    iVar1 = (*((*ppTVar3)->super_CPT).super_Function._vptr_Function[0x11])(hcpt);
    ppTVar4 = std::vector<despot::TabularCPT_*,_std::allocator<despot::TabularCPT_*>_>::operator[]
                        (&local_20->cpts_,(long)local_4c);
    *ppTVar4 = (value_type)CONCAT44(extraout_var,iVar1);
    local_4c = local_4c + 1;
  }
  return &local_20->super_CPT;
}

Assistant:

CPT* HierarchyCPT::CreateNoisyVariant(double noise) const {
	HierarchyCPT* hcpt = new HierarchyCPT(child_, parents_);
	for (int i = 0; i < cpts_.size(); i++)
		hcpt->cpts_[i] = static_cast<TabularCPT*>(cpts_[i]->CreateNoisyVariant(
			noise));
	return hcpt;
}